

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

uint __thiscall ONX_ErrorCounter::AddLibraryWarnings(ONX_ErrorCounter *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = this->m_opennurbs_library_warning_count;
  uVar3 = this->m_state_bit_field & 2;
  uVar4 = uVar3 >> 1;
  uVar1 = ON_GetWarningCount();
  this->m_opennurbs_library_warning_count = uVar1;
  *(byte *)&this->m_state_bit_field = (byte)this->m_state_bit_field | 2;
  uVar1 = uVar1 - uVar2;
  uVar2 = uVar4;
  if (uVar3 != 0) {
    uVar2 = uVar1;
  }
  if ((uVar2 != 0 & (byte)uVar4) == 1) {
    this->m_warning_count = this->m_warning_count + uVar1;
  }
  return uVar2;
}

Assistant:

unsigned int ONX_ErrorCounter::AddLibraryWarnings()
{
  const bool bActive = (0 != (2 & m_state_bit_field));
  const unsigned int count0 = m_opennurbs_library_warning_count;
  ClearLibraryWarnings();
  const unsigned int count
    = bActive
    ? (m_opennurbs_library_warning_count - count0)
    : 0U;
  if (bActive && count>0)
    m_warning_count += count; // <- Good location for a debugger breakpoint.
  return count;
}